

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  _Alloc_hider _Var1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  size_type *local_78;
  string flag_str;
  long local_48;
  long lStack_40;
  undefined4 local_34;
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"--","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_98);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar3[3];
      flag_str.field_2._8_8_ = &local_48;
    }
    else {
      local_48 = *plVar4;
      flag_str.field_2._8_8_ = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(flag_str.field_2._M_local_buf + 8);
    local_34 = (undefined4)CONCAT71(in_register_00000011,def_optional);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      flag_str._M_string_length = *psVar5;
      flag_str.field_2._M_allocated_capacity = plVar3[3];
      local_78 = &flag_str._M_string_length;
    }
    else {
      flag_str._M_string_length = *psVar5;
      local_78 = (size_type *)*plVar3;
    }
    flag_str._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((long *)flag_str.field_2._8_8_ != &local_48) {
      operator_delete((void *)flag_str.field_2._8_8_);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    _Var1._M_p = flag_str._M_dataplus._M_p;
    psVar5 = local_78;
    iVar2 = strncmp(str,(char *)local_78,(size_t)flag_str._M_dataplus._M_p);
    if (iVar2 == 0) {
      pcVar6 = str + (long)_Var1._M_p;
      if ((((char)local_34 == '\0') || (str[(long)_Var1._M_p] != '\0')) &&
         (pcVar6 = pcVar6 + 1, str[(long)_Var1._M_p] != '=')) {
        pcVar6 = (char *)0x0;
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    if (psVar5 != &flag_str._M_string_length) {
      operator_delete(psVar5);
    }
  }
  return pcVar6;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}